

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O3

void __thiscall
duckdb::ExtraDropSecretInfo::Serialize(ExtraDropSecretInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ExtraDropInfoType>
            (serializer,(this->super_ExtraDropInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"persist_mode");
  Serializer::WriteValue<duckdb::SecretPersistType>
            (serializer,(this->super_ExtraDropInfo).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"secret_storage",&this->secret_storage);
  return;
}

Assistant:

void ExtraDropSecretInfo::Serialize(Serializer &serializer) const {
	ExtraDropInfo::Serialize(serializer);
	serializer.WriteProperty<SecretPersistType>(200, "persist_mode", persist_mode);
	serializer.WritePropertyWithDefault<string>(201, "secret_storage", secret_storage);
}